

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::MatchesRegexMatcher::MatchAndExplain<std::__cxx11::string>
          (MatchesRegexMatcher *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          MatchResultListener *param_2)

{
  element_type *peVar1;
  bool local_5a;
  undefined1 local_40 [8];
  string s2;
  MatchResultListener *param_2_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  MatchesRegexMatcher *this_local;
  
  s2.field_2._8_8_ = param_2;
  std::__cxx11::string::string((string *)local_40,(string *)s);
  if ((this->full_match_ & 1U) == 0) {
    peVar1 = std::
             __shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_5a = RE::PartialMatch((string *)local_40,peVar1);
  }
  else {
    peVar1 = std::
             __shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    local_5a = RE::FullMatch((string *)local_40,peVar1);
  }
  std::__cxx11::string::~string((string *)local_40);
  return local_5a;
}

Assistant:

bool MatchAndExplain(const MatcheeStringType& s,
                       MatchResultListener* /* listener */) const {
    const std::string s2(s);
    return full_match_ ? RE::FullMatch(s2, *regex_)
                       : RE::PartialMatch(s2, *regex_);
  }